

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_function.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableBindReplace(duckdb *this,ClientContext *context,TableFunctionBindInput *input)

{
  _Alloc_hider _Var1;
  bool bVar2;
  pointer pVVar3;
  reference pvVar4;
  long *plVar5;
  undefined8 *puVar6;
  vector<duckdb::Value,_true> *pvVar7;
  const_reference pvVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  BinderException *this_00;
  InvalidInputException *pIVar10;
  size_type *psVar11;
  long *plVar12;
  char *pcVar13;
  size_type __n;
  string union_all_clause;
  string child;
  QualifiedName qualified_name;
  string query;
  string from_path;
  unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true> subquery_ref;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  string local_1a0;
  QualifiedName local_180;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_120;
  string local_118;
  QualifiedName local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  ClientContext *local_58;
  string local_50;
  
  pvVar7 = input->inputs;
  for (pVVar3 = (pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start; local_120._M_head_impl = (TableRef *)this,
      local_58 = context,
      pVVar3 != (pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    if (pVVar3->is_null == true) {
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      local_180.catalog._M_dataplus._M_p = (pointer)&local_180.catalog.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"Cannot use NULL as function argument","");
      BinderException::BinderException(this_00,&local_180.catalog);
      __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  if ((long)(pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start == 0x80) {
    pvVar4 = vector<duckdb::Value,_true>::operator[](pvVar7,1);
    if ((pvVar4->type_).id_ == BOOLEAN) {
      pvVar4 = vector<duckdb::Value,_true>::operator[](input->inputs,1);
      bVar2 = Value::GetValue<bool>(pvVar4);
      goto LAB_0118fead;
    }
  }
  bVar2 = false;
LAB_0118fead:
  pcVar13 = anon_var_dwarf_4f001a4 + 9;
  if (bVar2 != false) {
    pcVar13 = "BY NAME ";
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,pcVar13,pcVar13 + (ulong)bVar2 * 8);
  pvVar4 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  if ((pvVar4->type_).id_ == VARCHAR) {
    pvVar4 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    Value::ToString_abi_cxx11_(&local_f8.catalog,pvVar4);
    QualifiedName::Parse(&local_180,&local_f8.catalog);
    QualifiedName::ToString_abi_cxx11_(&local_1a0,&local_180);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1e0cdc9);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar9) {
      local_1b0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_1b0._8_8_ = plVar5[3];
      local_1c0 = &local_1b0;
    }
    else {
      local_1b0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5;
    }
    *plVar5 = (long)paVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_1c0);
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.name._M_dataplus._M_p != &local_180.name.field_2) {
      operator_delete(local_180.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.schema._M_dataplus._M_p != &local_180.schema.field_2) {
      operator_delete(local_180.schema._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.catalog._M_dataplus._M_p != &local_180.catalog.field_2) {
      operator_delete(local_180.catalog._M_dataplus._M_p);
    }
    paVar9 = &local_f8.catalog.field_2;
    local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8.catalog._M_dataplus._M_p;
  }
  else {
    pvVar4 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    LogicalType::LogicalType((LogicalType *)&local_f8,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_180,(LogicalType *)&local_f8);
    bVar2 = LogicalType::operator==(&pvVar4->type_,(LogicalType *)&local_180);
    LogicalType::~LogicalType((LogicalType *)&local_180);
    LogicalType::~LogicalType((LogicalType *)&local_f8);
    if (!bVar2) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_180.catalog._M_dataplus._M_p = (pointer)&local_180.catalog.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"Expected a table or a list with tables as input","");
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_180);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::operator+(&local_180.catalog," UNION ALL ",&local_98);
    puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_180);
    local_1c0 = &local_1b0;
    psVar11 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1b0._M_allocated_capacity = *psVar11;
      local_1b0._8_8_ = puVar6[3];
    }
    else {
      local_1b0._M_allocated_capacity = *psVar11;
      local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    *puVar6 = psVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.catalog._M_dataplus._M_p != &local_180.catalog.field_2) {
      operator_delete(local_180.catalog._M_dataplus._M_p);
    }
    pvVar4 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
    pvVar7 = ListValue::GetChildren(pvVar4);
    if ((pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_180.catalog._M_dataplus._M_p = (pointer)&local_180.catalog.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"Input list is empty","");
      InvalidInputException::InvalidInputException(pIVar10,(string *)&local_180);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar8 = vector<duckdb::Value,_true>::operator[](pvVar7,0);
    Value::ToString_abi_cxx11_(&local_f8.catalog,pvVar8);
    QualifiedName::Parse(&local_180,&local_f8.catalog);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.catalog._M_dataplus._M_p != &local_f8.catalog.field_2) {
      operator_delete(local_f8.catalog._M_dataplus._M_p);
    }
    QualifiedName::ToString_abi_cxx11_(&local_1a0,&local_180);
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1e0cdc9);
    local_f8.catalog._M_dataplus._M_p = (pointer)&local_f8.catalog.field_2;
    psVar11 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_f8.catalog.field_2._M_allocated_capacity = *psVar11;
      local_f8.catalog.field_2._8_8_ = puVar6[3];
    }
    else {
      local_f8.catalog.field_2._M_allocated_capacity = *psVar11;
      local_f8.catalog._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_f8.catalog._M_string_length = puVar6[1];
    *puVar6 = psVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_f8.catalog._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.catalog._M_dataplus._M_p != &local_f8.catalog.field_2) {
      operator_delete(local_f8.catalog._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if (0x40 < (ulong)((long)(pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar7->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      __n = 1;
      do {
        pvVar8 = vector<duckdb::Value,_true>::operator[](pvVar7,__n);
        Value::ToString_abi_cxx11_(&local_1a0,pvVar8);
        QualifiedName::Parse(&local_f8,&local_1a0);
        QualifiedName::ToString_abi_cxx11_(&local_50,&local_f8);
        plVar5 = (long *)::std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,(ulong)local_1c0);
        plVar12 = plVar5 + 2;
        if ((long *)*plVar5 == plVar12) {
          local_68 = *plVar12;
          lStack_60 = plVar5[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar12;
          local_78 = (long *)*plVar5;
        }
        local_70 = plVar5[1];
        *plVar5 = (long)plVar12;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.name._M_dataplus._M_p != &local_f8.name.field_2) {
          operator_delete(local_f8.name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.schema._M_dataplus._M_p != &local_f8.schema.field_2) {
          operator_delete(local_f8.schema._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.catalog._M_dataplus._M_p != &local_f8.catalog.field_2) {
          operator_delete(local_f8.catalog._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(pvVar7->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar7->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.name._M_dataplus._M_p != &local_180.name.field_2) {
      operator_delete(local_180.name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.schema._M_dataplus._M_p != &local_180.schema.field_2) {
      operator_delete(local_180.schema._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.catalog._M_dataplus._M_p != &local_180.catalog.field_2) {
      operator_delete(local_180.catalog._M_dataplus._M_p);
    }
    paVar9 = &local_1b0;
  }
  if (local_1c0 != paVar9) {
    operator_delete(local_1c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  ClientContext::GetParserOptions((ParserOptions *)&local_f8,local_58);
  paVar9 = &local_180.catalog.field_2;
  local_180.catalog._M_dataplus._M_p = (pointer)paVar9;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"Expected a table or a list with tables as input","");
  ParseSubquery((duckdb *)&local_98,&local_118,(ParserOptions *)&local_f8,&local_180.catalog);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.catalog._M_dataplus._M_p != paVar9) {
    operator_delete(local_180.catalog._M_dataplus._M_p);
  }
  _Var1._M_p = local_98._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)0x0;
  (local_120._M_head_impl)->_vptr_TableRef = (_func_int **)_Var1._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
         local_120._M_head_impl;
}

Assistant:

static unique_ptr<TableRef> TableBindReplace(ClientContext &context, TableFunctionBindInput &input) {
	auto query = UnionTablesQuery(input);
	auto subquery_ref =
	    ParseSubquery(query, context.GetParserOptions(), "Expected a table or a list with tables as input");
	return std::move(subquery_ref);
}